

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * __thiscall CMU462::Matrix3x3::operator-(Matrix3x3 *this)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  Matrix3x3 *B;
  Matrix3x3 *in_RDI;
  
  uVar1 = *(uint *)((long)&this->entries[0].x + 4);
  uVar2 = *(undefined4 *)&this->entries[0].y;
  uVar3 = *(uint *)((long)&this->entries[0].y + 4);
  *(undefined4 *)&in_RDI->entries[0].x = *(undefined4 *)&this->entries[0].x;
  *(uint *)((long)&in_RDI->entries[0].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[0].y = uVar2;
  *(uint *)((long)&in_RDI->entries[0].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[2].x + 4);
  uVar2 = *(undefined4 *)&this->entries[2].y;
  uVar3 = *(uint *)((long)&this->entries[2].y + 4);
  *(undefined4 *)&in_RDI->entries[2].x = *(undefined4 *)&this->entries[2].x;
  *(uint *)((long)&in_RDI->entries[2].x + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[2].y = uVar2;
  *(uint *)((long)&in_RDI->entries[2].y + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[0].z + 4);
  uVar2 = *(undefined4 *)&this->entries[1].x;
  uVar3 = *(uint *)((long)&this->entries[1].x + 4);
  *(undefined4 *)&in_RDI->entries[0].z = *(undefined4 *)&this->entries[0].z;
  *(uint *)((long)&in_RDI->entries[0].z + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[1].x = uVar2;
  *(uint *)((long)&in_RDI->entries[1].x + 4) = uVar3 ^ 0x80000000;
  uVar1 = *(uint *)((long)&this->entries[1].y + 4);
  uVar2 = *(undefined4 *)&this->entries[1].z;
  uVar3 = *(uint *)((long)&this->entries[1].z + 4);
  *(undefined4 *)&in_RDI->entries[1].y = *(undefined4 *)&this->entries[1].y;
  *(uint *)((long)&in_RDI->entries[1].y + 4) = uVar1 ^ 0x80000000;
  *(undefined4 *)&in_RDI->entries[1].z = uVar2;
  *(uint *)((long)&in_RDI->entries[1].z + 4) = uVar3 ^ 0x80000000;
  in_RDI->entries[2].z = -this->entries[2].z;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( void ) const {

   // returns -A
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2);
    B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2);
    B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2);

    return B;
  }